

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::load(File *this,string *fileName)

{
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  TagVector *pTVar5;
  size_type sVar6;
  reference ppTVar7;
  uint local_3c4;
  stringstream local_3c0 [4];
  uint i;
  stringstream stream;
  long local_228;
  ifstream file;
  bool local_19;
  bool success;
  string *fileName_local;
  File *this_local;
  
  local_19 = true;
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_228,uVar3,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_3c0);
    file2StringStream(this,(ifstream *)&local_228,(stringstream *)local_3c0);
    local_3c4 = 0;
    while( true ) {
      pTVar5 = elements(this);
      sVar6 = std::vector<Tag_*,_std::allocator<Tag_*>_>::size(pTVar5);
      if (sVar6 <= local_3c4) break;
      pTVar5 = elements(this);
      ppTVar7 = std::vector<Tag_*,_std::allocator<Tag_*>_>::operator[](pTVar5,(ulong)local_3c4);
      uVar2 = (*((*ppTVar7)->super_StreamObject)._vptr_StreamObject[1])(*ppTVar7,local_3c0);
      local_19 = (bool)((byte)uVar2 & 1);
      if ((uVar2 & 1) == 0) {
        std::ifstream::close();
        break;
      }
      local_3c4 = local_3c4 + 1;
    }
    std::__cxx11::stringstream::~stringstream(local_3c0);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: File \"");
    poVar4 = std::operator<<(poVar4,(string *)fileName);
    poVar4 = std::operator<<(poVar4,"\" doesn\'t exist!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_19 = false;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_228);
  return local_19;
}

Assistant:

bool File::load( std::string fileName )
{
	bool success = true;

	std::ifstream file( fileName.c_str() );

	if ( !file )
	{
                std::cerr << "Error: File \"" << fileName << "\" doesn't exist!" << std::endl;
		success = false;
        } else {

            std::stringstream stream;

            file2StringStream( file, stream );

            for ( unsigned int i = 0; i < elements().size();i++ ) {
		success = elements()[i]->read( stream );

		if ( !success )
		{
			file.close();
			break;
		}
            }
        }

	file.close();

	return success;
}